

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetIncludeDirectoriesCommand.cxx
# Opt level: O0

bool __thiscall
cmTargetIncludeDirectoriesCommand::HandleDirectContent
          (cmTargetIncludeDirectoriesCommand *this,cmTarget *tgt,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *content,bool prepend,bool system)

{
  string local_c8;
  undefined1 local_a8 [8];
  cmValueWithOrigin entry;
  cmListFileBacktrace lfbt;
  bool system_local;
  bool prepend_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *content_local;
  cmTarget *tgt_local;
  cmTargetIncludeDirectoriesCommand *this_local;
  
  cmMakefile::GetBacktrace
            ((cmListFileBacktrace *)&entry.Backtrace.Snapshot.Position.Position,
             (this->super_cmTargetPropCommandBase).super_cmCommand.Makefile);
  (*(this->super_cmTargetPropCommandBase).super_cmCommand.super_cmObject._vptr_cmObject[0x11])
            (&local_c8,this,content);
  cmValueWithOrigin::cmValueWithOrigin
            ((cmValueWithOrigin *)local_a8,&local_c8,
             (cmListFileBacktrace *)&entry.Backtrace.Snapshot.Position.Position);
  std::__cxx11::string::~string((string *)&local_c8);
  cmTarget::InsertInclude(tgt,(cmValueWithOrigin *)local_a8,prepend);
  if (system) {
    cmTarget::AddSystemIncludeDirectories(tgt,content);
  }
  cmValueWithOrigin::~cmValueWithOrigin((cmValueWithOrigin *)local_a8);
  cmListFileBacktrace::~cmListFileBacktrace
            ((cmListFileBacktrace *)&entry.Backtrace.Snapshot.Position.Position);
  return true;
}

Assistant:

bool cmTargetIncludeDirectoriesCommand
::HandleDirectContent(cmTarget *tgt, const std::vector<std::string> &content,
                      bool prepend, bool system)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  cmValueWithOrigin entry(this->Join(content), lfbt);
  tgt->InsertInclude(entry, prepend);
  if (system)
    {
    tgt->AddSystemIncludeDirectories(content);
    }
  return true;
}